

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultShaderSourceStreamFactory.cpp
# Opt level: O0

void __thiscall
Diligent::DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory
          (DefaultShaderSourceStreamFactory *this,IReferenceCounters *pRefCounters,
          Char *SearchDirectories)

{
  allocator local_59;
  value_type local_58;
  DefaultShaderSourceStreamFactory *local_28;
  Char *local_20;
  Char *SearchDirectories_local;
  IReferenceCounters *pRefCounters_local;
  DefaultShaderSourceStreamFactory *this_local;
  
  local_20 = SearchDirectories;
  SearchDirectories_local = (Char *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  ObjectBase<Diligent::IShaderSourceInputStreamFactory>::ObjectBase
            (&this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>,pRefCounters);
  (this->super_ObjectBase<Diligent::IShaderSourceInputStreamFactory>).
  super_RefCountedObject<Diligent::IShaderSourceInputStreamFactory>.
  super_IShaderSourceInputStreamFactory.super_IObject._vptr_IObject =
       (_func_int **)&PTR_QueryInterface_01410020;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_SearchDirectories);
  local_28 = this;
  BasicFileSystem::
  SplitPathList<Diligent::DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory(Diligent::IReferenceCounters*,char_const*)::__0>
            (local_20,(anon_class_8_1_8991fb9c)this,';');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->m_SearchDirectories,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

DefaultShaderSourceStreamFactory::DefaultShaderSourceStreamFactory(IReferenceCounters* pRefCounters, const Char* SearchDirectories) :
    ObjectBase<IShaderSourceInputStreamFactory>(pRefCounters)
{
    FileSystem::SplitPathList(SearchDirectories,
                              [&](const char* Path, size_t Len) //
                              {
                                  String SearchPath{Path, Len};
                                  VERIFY_EXPR(!SearchPath.empty());
                                  if (!FileSystem::IsSlash(SearchPath.back()))
                                      SearchPath.push_back(FileSystem::SlashSymbol);
                                  m_SearchDirectories.emplace_back(std::move(SearchPath));
                                  return true;
                              });
    m_SearchDirectories.push_back("");
}